

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void muxBlankPL(string *appDir,BlurayHelper *blurayHelper,PIDListMap *pidList,DiskType dt,
               int blankNum)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  long lVar9;
  ssize_t sVar10;
  ostream *poVar11;
  undefined4 *puVar12;
  mapped_type *pmVar13;
  TSMuxer *mainMuxer;
  size_t __n;
  uint8_t *puVar14;
  void *__buf;
  uint8_t *puVar15;
  allocator<char> local_442;
  allocator<char> local_441;
  string dstFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string tmpFileName;
  uint *local_3c8;
  undefined8 local_3c0;
  uint local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  uint *local_3a8;
  undefined8 local_3a0;
  uint local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  videoParams;
  File file;
  ostringstream ss;
  
  p_Var8 = (pidList->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  puVar15 = pattern_1920;
  do {
    if ((_Rb_tree_header *)p_Var8 == &(pidList->_M_t)._M_impl.super__Rb_tree_header) {
      __buf = (void *)0x284;
LAB_001a7ab6:
      lVar9 = std::chrono::_V2::system_clock::now();
      std::__cxx11::string::string<std::allocator<char>>((string *)&videoParams,"blank_",&local_441)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                     appDir,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &videoParams);
      std::__cxx11::to_string(&dstFile,lVar9 / 1000);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                     &dstFile);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,".264",&local_442);
      std::operator+(&tmpFileName,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&ss);
      std::__cxx11::string::~string((string *)&dstFile);
      std::__cxx11::string::~string((string *)&file);
      std::__cxx11::string::~string((string *)&videoParams);
      File::File(&file);
      __n = 0;
      iVar6 = File::open(&file,tmpFileName._M_dataplus._M_p,2);
      if ((char)iVar6 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        poVar11 = std::operator<<((ostream *)&ss,"can\'t create file ");
        std::operator<<(poVar11,(string *)&tmpFileName);
        puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar12 = 3;
        *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
        if (local_3a8 == &local_398) {
          puVar12[6] = local_398;
          puVar12[7] = uStack_394;
          puVar12[8] = uStack_390;
          puVar12[9] = uStack_38c;
        }
        else {
          *(uint **)(puVar12 + 2) = local_3a8;
          *(ulong *)(puVar12 + 6) = CONCAT44(uStack_394,local_398);
        }
        *(undefined8 *)(puVar12 + 4) = local_3a0;
        local_3a0 = 0;
        local_398 = local_398 & 0xffffff00;
        local_3a8 = &local_398;
        __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      iVar6 = 4;
      puVar14 = (uint8_t *)tmpFileName._M_dataplus._M_p;
      do {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          File::close(&file,(int)puVar14);
          videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &videoParams._M_t._M_impl.super__Rb_tree_header._M_header;
          videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          videoParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"insertSEI",(allocator<char> *)&dstFile);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&videoParams,(key_type *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"fps",(allocator<char> *)&dstFile);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&videoParams,(key_type *)&ss);
          std::__cxx11::string::assign((char *)pmVar13);
          std::__cxx11::string::~string((string *)&ss);
          MuxerManager::MuxerManager
                    ((MuxerManager *)&ss,&readManager,&tsMuxerFactory.super_AbstractMuxerFactory);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dstFile,"MUXOPT --no-pcr-on-video-pid --vbr --avchd --vbv-len=500",
                     (allocator<char> *)&local_418);
          MuxerManager::parseMuxOpt((MuxerManager *)&ss,&dstFile);
          std::__cxx11::string::~string((string *)&dstFile);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&dstFile,"V_MPEG4/ISO/AVC",(allocator<char> *)&local_418);
          MuxerManager::addStream((MuxerManager *)&ss,&dstFile,&tmpFileName,&videoParams);
          std::__cxx11::string::~string((string *)&dstFile);
          BlurayHelper::m2tsFileName_abi_cxx11_(&dstFile,blurayHelper,blankNum);
          MuxerManager::doMux((MuxerManager *)&ss,&dstFile,&blurayHelper->super_FileFactory);
          mainMuxer = (TSMuxer *)MuxerManager::getMainMuxer((MuxerManager *)&ss);
          if ((mainMuxer == (TSMuxer *)0x0) ||
             ((mainMuxer->super_AbstractMuxer)._vptr_AbstractMuxer !=
              (_func_int **)&PTR__TSMuxer_0024c678)) {
            mainMuxer = (TSMuxer *)0x0;
          }
          local_418._M_dataplus._M_p = (pointer)0x0;
          local_418._M_string_length = 0;
          local_418.field_2._M_allocated_capacity = 0;
          BlurayHelper::createMPLSFile
                    (blurayHelper,mainMuxer,(TSMuxer *)0x0,0,
                     (vector<double,_std::allocator<double>_> *)&local_418,dt,blankNum,false);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&local_418);
          BlurayHelper::createCLPIFile(blurayHelper,mainMuxer,blankNum,true);
          std::__cxx11::string::~string((string *)&dstFile);
          MuxerManager::~MuxerManager((MuxerManager *)&ss);
          deleteFile(&tmpFileName);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&videoParams._M_t);
          File::~File(&file);
          std::__cxx11::string::~string((string *)&tmpFileName);
          return;
        }
        puVar14 = puVar15;
        sVar10 = File::write(&file,(int)puVar15,__buf,__n);
      } while ((int)sVar10 == (int)__buf);
      deleteFile(&tmpFileName);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar11 = std::operator<<((ostream *)&ss,"can\'t write data to file ");
      std::operator<<(poVar11,(string *)&tmpFileName);
      puVar12 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar12 = 3;
      *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
      if (local_3c8 == &local_3b8) {
        puVar12[6] = local_3b8;
        puVar12[7] = uStack_3b4;
        puVar12[8] = uStack_3b0;
        puVar12[9] = uStack_3ac;
      }
      else {
        *(uint **)(puVar12 + 2) = local_3c8;
        *(ulong *)(puVar12 + 6) = CONCAT44(uStack_3b4,local_3b8);
      }
      *(undefined8 *)(puVar12 + 4) = local_3c0;
      local_3b8 = local_3b8 & 0xffffff00;
      __cxa_throw(puVar12,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    if (p_Var8[6]._M_right != (_Base_ptr)0x0) {
      plVar7 = (long *)__dynamic_cast(p_Var8[6]._M_right,&AbstractStreamReader::typeinfo,
                                      &MPEGStreamReader::typeinfo,0);
      if (plVar7 != (long *)0x0) {
        uVar4 = (**(code **)(*plVar7 + 0xa0))(plVar7);
        uVar5 = (**(code **)(*plVar7 + 0xa8))(plVar7);
        dVar1 = (double)plVar7[0x11];
        if (uVar5 < 0x1e1 && uVar4 < 0x357) {
          if (0.5 <= ABS(25.0 - dVar1)) {
            bVar2 = 0.5 <= ABS(50.0 - dVar1);
          }
          else {
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
        }
        bVar3 = uVar5 < 0x241 && uVar4 < 0x401;
        if ((uVar5 < 0x241 && uVar4 < 0x401) && (0.5 <= ABS(25.0 - dVar1))) {
          bVar3 = ABS(50.0 - dVar1) < 0.5;
        }
        if (bVar2) {
          __buf = (void *)0xba;
          puVar15 = pattern_ntsc;
        }
        else {
          puVar14 = pattern_1280;
          if (0x513 < uVar4) {
            puVar14 = pattern_1920;
          }
          uVar5 = 0x151;
          if (0x513 < uVar4) {
            uVar5 = 0x284;
          }
          puVar15 = pattern_pal;
          if (!bVar3 && !bVar2) {
            puVar15 = puVar14;
          }
          __buf = (void *)0xcc;
          if (!bVar3 && !bVar2) {
            __buf = (void *)(ulong)uVar5;
          }
        }
        goto LAB_001a7ab6;
      }
    }
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void muxBlankPL(const string& appDir, BlurayHelper& blurayHelper, const PIDListMap& pidList, DiskType dt, int blankNum)
{
    unsigned videoWidth = 1920;
    unsigned videoHeight = 1080;
    double fps = 23.976;
    for (const auto& [pid, si] : pidList)
    {
        const PMTStreamInfo& streamInfo = si;
        const auto streamReader = dynamic_cast<const MPEGStreamReader*>(streamInfo.m_codecReader);
        if (streamReader)
        {
            videoWidth = streamReader->getStreamWidth();
            videoHeight = streamReader->getStreamHeight();
            fps = streamReader->getFPS();
            break;
        }
    }
    uint8_t* pattern;
    int patternSize;
    bool isNtsc = videoWidth <= 854 && videoHeight <= 480 && (fabs(25 - fps) >= 0.5 && fabs(50 - fps) >= 0.5);
    bool isPal = videoWidth <= 1024 && videoHeight <= 576 && (fabs(25 - fps) < 0.5 || fabs(50 - fps) < 0.5);
    if (isNtsc)
    {
        pattern = pattern_ntsc;
        patternSize = sizeof(pattern_ntsc);
    }
    else if (isPal)
    {
        pattern = pattern_pal;
        patternSize = sizeof(pattern_pal);
    }
    else if (videoWidth >= 1300)
    {
        pattern = pattern_1920;
        patternSize = sizeof(pattern_1920);
    }
    else
    {
        pattern = pattern_1280;
        patternSize = sizeof(pattern_1280);
    }
    auto fname_time = std::chrono::duration_cast<std::chrono::microseconds>(
                          std::chrono::high_resolution_clock::now().time_since_epoch())
                          .count();
    string tmpFileName = appDir + string("blank_") + std::to_string(fname_time) + string(".264");
    File file;
    if (!file.open(tmpFileName.c_str(), File::ofWrite))
        THROW(ERR_COMMON, "can't create file " << tmpFileName)
    for (int i = 0; i < 3; ++i)
    {
        if (file.write(pattern, patternSize) != patternSize)
        {
            deleteFile(tmpFileName);
            THROW(ERR_COMMON, "can't write data to file " << tmpFileName)
        }
    }
    file.close();
    map<string, string> videoParams;
    videoParams["insertSEI"];
    videoParams["fps"] = "23.976";
    {
        MuxerManager muxerManager(readManager, tsMuxerFactory);
        muxerManager.parseMuxOpt("MUXOPT --no-pcr-on-video-pid --vbr --avchd --vbv-len=500");
        muxerManager.addStream("V_MPEG4/ISO/AVC", tmpFileName, videoParams);
        string dstFile = blurayHelper.m2tsFileName(blankNum);
        muxerManager.doMux(dstFile, &blurayHelper);

        auto tsMuxer = dynamic_cast<TSMuxer*>(muxerManager.getMainMuxer());

        blurayHelper.createMPLSFile(tsMuxer, nullptr, 0, vector<double>(), dt, blankNum, false);
        blurayHelper.createCLPIFile(tsMuxer, blankNum, true);
    }
    deleteFile(tmpFileName);
}